

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O2

void rw::ps2::genericPreCB(MatPipeline *pipe,Geometry *geo)

{
  long lVar1;
  long lVar2;
  
  lVar2 = 4;
  do {
    if (lVar2 == 0xe) goto LAB_00122564;
    lVar1 = lVar2 + -4;
    lVar2 = lVar2 + 1;
  } while (pipe->attribs[lVar1] != (PipeAttribute *)attribXYZW);
  allocateADC(geo);
LAB_00122564:
  skinPreCB(pipe,geo);
  return;
}

Assistant:

void
genericPreCB(MatPipeline *pipe, Geometry *geo)
{
	PipeAttribute *a;
	for(int32 i = 0; i < (int)nelem(pipe->attribs); i++)
		if((a = pipe->attribs[i]))
			if(a == &attribXYZW){
				allocateADC(geo);
				break;
			}
	skinPreCB(pipe, geo);
}